

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
VanSimulationDataGenerator::VanSimulationDataGenerator(VanSimulationDataGenerator *this)

{
  (this->mSerialText)._M_dataplus._M_p = (pointer)&(this->mSerialText).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->mSerialText,"My first analyzer, woo hoo!","");
  this->mStringIndex = 0;
  SimulationChannelDescriptor::SimulationChannelDescriptor(&this->mSerialSimulationData);
  return;
}

Assistant:

VanSimulationDataGenerator::VanSimulationDataGenerator()
:	mSerialText( "My first analyzer, woo hoo!" ),
    mStringIndex( 0 )
{
}